

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

ParseResult * __thiscall
cxxopts::OptionParser::parse
          (ParseResult *__return_storage_ptr__,OptionParser *this,int argc,char **argv)

{
  char cVar1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
  *this_00;
  undefined8 uVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  const_reference pvVar7;
  difference_type dVar8;
  long lVar9;
  char *pcVar10;
  pointer pvVar11;
  long lVar12;
  Value *pVVar13;
  element_type *peVar14;
  size_t sVar15;
  vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> local_2d0;
  undefined1 local_2b2;
  allocator local_2b1;
  value_type local_2b0;
  allocator local_289;
  string local_288;
  size_t local_268;
  OptionValue *local_260;
  mapped_type *store;
  Value *value_1;
  shared_ptr<cxxopts::OptionDetails> *detail;
  value_type *opt_1;
  const_iterator __end1;
  const_iterator __begin1;
  OptionMap *__range1;
  undefined1 local_208 [8];
  shared_ptr<cxxopts::OptionDetails> opt;
  value_type local_1f0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
  local_1d0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
  local_1c8;
  const_iterator iter_1;
  string *name_1;
  undefined1 local_178 [8];
  shared_ptr<cxxopts::OptionDetails> value;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
  local_160;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
  local_158;
  const_iterator iter;
  undefined1 local_148 [8];
  string name;
  size_t i;
  size_t *local_100;
  string *s;
  value_type local_f0;
  allocator local_c9;
  string local_c8;
  allocator local_a1;
  string local_a0;
  undefined1 local_70 [8];
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unmatched;
  PositionalListIterator next_positional;
  bool consume_remaining;
  int current;
  char **argv_local;
  int argc_local;
  OptionParser *this_local;
  ParseResult *parsed;
  
  next_positional._M_current._4_4_ = 1;
  next_positional._M_current._3_1_ = 0;
  unmatched.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin(this->m_positional);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&result._M_begin);
  while (next_positional._M_current._4_4_ != argc) {
    iVar5 = strcmp(argv[next_positional._M_current._4_4_],"--");
    if (iVar5 == 0) {
      next_positional._M_current._3_1_ = 1;
      next_positional._M_current._4_4_ = next_positional._M_current._4_4_ + 1;
      break;
    }
    std::__cxx11::
    match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
    match_results((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   *)local_70);
    std::
    regex_match<char,std::allocator<std::__cxx11::sub_match<char_const*>>,std::__cxx11::regex_traits<char>>
              (argv[next_positional._M_current._4_4_],
               (match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                *)local_70,
               (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               (anonymous_namespace)::option_matcher_abi_cxx11_,0);
    bVar3 = std::__cxx11::
            match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
            empty((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   *)local_70);
    if (bVar3) {
      if (((*argv[next_positional._M_current._4_4_] == '-') &&
          (argv[next_positional._M_current._4_4_][1] != '\0')) &&
         ((this->m_allow_unrecognised & 1U) == 0)) {
        pcVar10 = argv[next_positional._M_current._4_4_];
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_a0,pcVar10,&local_a1);
        throw_or_mimic<cxxopts::option_syntax_exception>(&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      }
      pcVar10 = argv[next_positional._M_current._4_4_];
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_c8,pcVar10,&local_c9);
      bVar3 = consume_positional(this,&local_c8,
                                 (PositionalListIterator *)
                                 &unmatched.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_c9);
      if (!bVar3) {
        pcVar10 = argv[next_positional._M_current._4_4_];
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_f0,pcVar10,(allocator *)((long)&s + 7));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&result._M_begin,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&s + 7));
      }
LAB_0012083f:
      next_positional._M_current._4_4_ = next_positional._M_current._4_4_ + 1;
      value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ._4_4_ = 0;
    }
    else {
      pvVar7 = std::__cxx11::
               match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               ::operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             *)local_70,4);
      dVar8 = std::__cxx11::sub_match<const_char_*>::length(pvVar7);
      if (dVar8 != 0) {
        pvVar7 = std::__cxx11::
                 match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 ::operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                               *)local_70,4);
        std::__cxx11::sub_match::operator_cast_to_string((string_type *)&i,(sub_match *)pvVar7);
        local_100 = &i;
        for (name.field_2._8_8_ = 0; uVar2 = name.field_2._8_8_,
            lVar9 = std::__cxx11::string::size(), uVar2 != lVar9;
            name.field_2._8_8_ = name.field_2._8_8_ + 1) {
          pcVar10 = (char *)std::__cxx11::string::operator[]((ulong)local_100);
          cVar1 = *pcVar10;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_148,1,cVar1,
                     (allocator *)
                     ((long)&iter.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                             ._M_cur + 7));
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&iter.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                             ._M_cur + 7));
          local_158._M_cur =
               (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
               ::find(this->m_options,(key_type *)local_148);
          local_160._M_cur =
               (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
               ::end(this->m_options);
          bVar3 = std::__detail::operator==(&local_158,&local_160);
          if (bVar3) {
            if ((this->m_allow_unrecognised & 1U) == 0) {
              throw_or_mimic<cxxopts::option_not_exists_exception>((string *)local_148);
              goto LAB_00120351;
            }
            value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi._4_4_ = 6;
          }
          else {
LAB_00120351:
            pvVar11 = std::__detail::
                      _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_false,_true>
                      ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_false,_true>
                                    *)&local_158);
            std::shared_ptr<cxxopts::OptionDetails>::shared_ptr
                      ((shared_ptr<cxxopts::OptionDetails> *)local_178,&pvVar11->second);
            lVar9 = name.field_2._8_8_ + 1;
            lVar12 = std::__cxx11::string::size();
            if (lVar9 == lVar12) {
              checked_parse_arg(this,argc,argv,(int *)((long)&next_positional._M_current + 4),
                                (shared_ptr<cxxopts::OptionDetails> *)local_178,(string *)local_148)
              ;
            }
            else {
              peVar14 = std::
                        __shared_ptr_access<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)local_178);
              pVVar13 = OptionDetails::value(peVar14);
              uVar6 = (*pVVar13->_vptr_Value[7])();
              if ((uVar6 & 1) == 0) {
                throw_or_mimic<cxxopts::option_requires_argument_exception>((string *)local_148);
              }
              else {
                peVar14 = std::
                          __shared_ptr_access<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)local_178);
                pVVar13 = OptionDetails::value(peVar14);
                (*pVVar13->_vptr_Value[9])(&name_1);
                parse_option(this,(shared_ptr<cxxopts::OptionDetails> *)local_178,
                             (string *)local_148,(string *)&name_1);
                std::__cxx11::string::~string((string *)&name_1);
              }
            }
            std::shared_ptr<cxxopts::OptionDetails>::~shared_ptr
                      ((shared_ptr<cxxopts::OptionDetails> *)local_178);
            value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi._4_4_ = 0;
          }
          std::__cxx11::string::~string((string *)local_148);
        }
        std::__cxx11::string::~string((string *)&i);
        goto LAB_0012083f;
      }
      pvVar7 = std::__cxx11::
               match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               ::operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             *)local_70,1);
      dVar8 = std::__cxx11::sub_match<const_char_*>::length(pvVar7);
      if (dVar8 == 0) goto LAB_0012083f;
      pvVar7 = std::__cxx11::
               match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               ::operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             *)local_70,1);
      std::__cxx11::sub_match::operator_cast_to_string((string_type *)&iter_1,(sub_match *)pvVar7);
      local_1c8._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
           ::find(this->m_options,(key_type *)&iter_1);
      local_1d0._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
           ::end(this->m_options);
      bVar3 = std::__detail::operator==(&local_1c8,&local_1d0);
      if (bVar3) {
        if ((this->m_allow_unrecognised & 1U) == 0) {
          throw_or_mimic<cxxopts::option_not_exists_exception>((key_type *)&iter_1);
          goto LAB_001206e9;
        }
        pcVar10 = argv[next_positional._M_current._4_4_];
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_1f0,pcVar10,
                   (allocator *)
                   ((long)&opt.
                           super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 7));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&result._M_begin,&local_1f0);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&opt.
                           super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 7));
        next_positional._M_current._4_4_ = next_positional._M_current._4_4_ + 1;
        value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._4_4_ = 2;
      }
      else {
LAB_001206e9:
        pvVar11 = std::__detail::
                  _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_false,_true>
                  ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_false,_true>
                                *)&local_1c8);
        std::shared_ptr<cxxopts::OptionDetails>::shared_ptr
                  ((shared_ptr<cxxopts::OptionDetails> *)local_208,&pvVar11->second);
        pvVar7 = std::__cxx11::
                 match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 ::operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                               *)local_70,2);
        dVar8 = std::__cxx11::sub_match<const_char_*>::length(pvVar7);
        if (dVar8 == 0) {
          checked_parse_arg(this,argc,argv,(int *)((long)&next_positional._M_current + 4),
                            (shared_ptr<cxxopts::OptionDetails> *)local_208,(key_type *)&iter_1);
        }
        else {
          pvVar7 = std::__cxx11::
                   match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   ::operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                 *)local_70,3);
          std::__cxx11::sub_match::operator_cast_to_string
                    ((string_type *)&__range1,(sub_match *)pvVar7);
          parse_option(this,(shared_ptr<cxxopts::OptionDetails> *)local_208,(key_type *)&iter_1,
                       (string *)&__range1);
          std::__cxx11::string::~string((string *)&__range1);
        }
        std::shared_ptr<cxxopts::OptionDetails>::~shared_ptr
                  ((shared_ptr<cxxopts::OptionDetails> *)local_208);
        value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._4_4_ = 0;
      }
      std::__cxx11::string::~string((string *)&iter_1);
      if (value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi._4_4_ == 0) goto LAB_0012083f;
    }
    std::__cxx11::
    match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
    ~match_results((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    *)local_70);
  }
  this_00 = this->m_options;
  __end1 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
           ::begin(this_00);
  opt_1 = (value_type *)
          std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
          ::end(this_00);
  while (bVar3 = std::__detail::operator!=
                           (&__end1.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                            ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                              *)&opt_1), bVar3) {
    detail = (shared_ptr<cxxopts::OptionDetails> *)
             std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_false,_true>
             ::operator*(&__end1);
    value_1 = (Value *)&((reference)detail)->second;
    peVar14 = std::
              __shared_ptr_access<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)value_1);
    store = (mapped_type *)OptionDetails::value(peVar14);
    peVar14 = std::
              __shared_ptr_access<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)value_1);
    local_268 = OptionDetails::hash(peVar14);
    local_260 = std::
                unordered_map<unsigned_long,_cxxopts::OptionValue,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>_>
                ::operator[](&this->m_parsed,&local_268);
    bVar4 = (*(code *)store->m_long_name[1]._M_string_length)();
    if ((((bVar4 & 1) != 0) && (sVar15 = OptionValue::count(local_260), sVar15 == 0)) &&
       (bVar3 = OptionValue::has_default(local_260), !bVar3)) {
      parse_default(this,(shared_ptr<cxxopts::OptionDetails> *)value_1);
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_false,_true>
    ::operator++(&__end1);
  }
  if ((next_positional._M_current._3_1_ & 1) != 0) {
    for (; next_positional._M_current._4_4_ < argc;
        next_positional._M_current._4_4_ = next_positional._M_current._4_4_ + 1) {
      pcVar10 = argv[next_positional._M_current._4_4_];
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_288,pcVar10,&local_289);
      bVar3 = consume_positional(this,&local_288,
                                 (PositionalListIterator *)
                                 &unmatched.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)&local_288);
      std::allocator<char>::~allocator((allocator<char> *)&local_289);
      if (((bVar3 ^ 0xffU) & 1) != 0) break;
    }
    for (; next_positional._M_current._4_4_ != argc;
        next_positional._M_current._4_4_ = next_positional._M_current._4_4_ + 1) {
      pcVar10 = argv[next_positional._M_current._4_4_];
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2b0,pcVar10,&local_2b1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&result._M_begin,&local_2b0);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
    }
  }
  finalise_aliases(this);
  local_2b2 = 0;
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::vector
            (&local_2d0,&this->m_sequential);
  ParseResult::ParseResult
            (__return_storage_ptr__,&this->m_keys,&this->m_parsed,&local_2d0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&result._M_begin);
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector(&local_2d0);
  value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = 1;
  local_2b2 = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&result._M_begin);
  return __return_storage_ptr__;
}

Assistant:

inline ParseResult
OptionParser::parse(int argc, const char* const* argv)
{
  int current = 1;
  bool consume_remaining = false;
  PositionalListIterator next_positional = m_positional.begin();

  std::vector<std::string> unmatched;

  while (current != argc)
  {
    if (strcmp(argv[current], "--") == 0)
    {
      consume_remaining = true;
      ++current;
      break;
    }

    std::match_results<const char*> result;
    std::regex_match(argv[current], result, option_matcher);

    if (result.empty())
    {
      //not a flag

      // but if it starts with a `-`, then it's an error
      if (argv[current][0] == '-' && argv[current][1] != '\0') {
        if (!m_allow_unrecognised) {
          throw_or_mimic<option_syntax_exception>(argv[current]);
        }
      }

      //if true is returned here then it was consumed, otherwise it is
      //ignored
      if (consume_positional(argv[current], next_positional))
      {
      }
      else
      {
        unmatched.push_back(argv[current]);
      }
      //if we return from here then it was parsed successfully, so continue
    }
    else
    {
      //short or long option?
      if (result[4].length() != 0)
      {
        const std::string& s = result[4];

        for (std::size_t i = 0; i != s.size(); ++i)
        {
          std::string name(1, s[i]);
          auto iter = m_options.find(name);

          if (iter == m_options.end())
          {
            if (m_allow_unrecognised)
            {
              continue;
            }
            //error
            throw_or_mimic<option_not_exists_exception>(name);
          }

          auto value = iter->second;

          if (i + 1 == s.size())
          {
            //it must be the last argument
            checked_parse_arg(argc, argv, current, value, name);
          }
          else if (value->value().has_implicit())
          {
            parse_option(value, name, value->value().get_implicit_value());
          }
          else
          {
            //error
            throw_or_mimic<option_requires_argument_exception>(name);
          }
        }
      }
      else if (result[1].length() != 0)
      {
        const std::string& name = result[1];

        auto iter = m_options.find(name);

        if (iter == m_options.end())
        {
          if (m_allow_unrecognised)
          {
            // keep unrecognised options in argument list, skip to next argument
            unmatched.push_back(argv[current]);
            ++current;
            continue;
          }
          //error
          throw_or_mimic<option_not_exists_exception>(name);
        }

        auto opt = iter->second;

        //equals provided for long option?
        if (result[2].length() != 0)
        {
          //parse the option given

          parse_option(opt, name, result[3]);
        }
        else
        {
          //parse the next argument
          checked_parse_arg(argc, argv, current, opt, name);
        }
      }

    }

    ++current;
  }

  for (auto& opt : m_options)
  {
    auto& detail = opt.second;
    const auto& value = detail->value();

    auto& store = m_parsed[detail->hash()];

    if(value.has_default() && !store.count() && !store.has_default()){
      parse_default(detail);
    }
  }

  if (consume_remaining)
  {
    while (current < argc)
    {
      if (!consume_positional(argv[current], next_positional)) {
        break;
      }
      ++current;
    }

    //adjust argv for any that couldn't be swallowed
    while (current != argc) {
      unmatched.push_back(argv[current]);
      ++current;
    }
  }

  finalise_aliases();

  ParseResult parsed(std::move(m_keys), std::move(m_parsed), std::move(m_sequential), std::move(unmatched));
  return parsed;
}